

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution.hpp
# Opt level: O0

bool __thiscall diy::Master::ProcessBlock::all_skip(ProcessBlock *this,int i)

{
  bool bVar1;
  uint uVar2;
  pointer pBVar3;
  uint in_ESI;
  vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  *in_RDI;
  unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_> *cmd;
  iterator __end1;
  iterator __begin1;
  Commands *__range1;
  bool skip;
  __normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
  local_20;
  pointer local_18;
  byte local_d;
  uint local_c;
  
  local_d = 1;
  local_18 = (in_RDI->
             super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x40;
  local_c = in_ESI;
  local_20._M_current =
       (unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_> *)
       std::
       vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
       ::begin(in_RDI);
  std::
  vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  ::end(in_RDI);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
                        *)in_RDI);
    if (!bVar1) {
LAB_0014fc72:
      return (bool)(local_d & 1);
    }
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
          *)__gnu_cxx::
            __normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
            ::operator*(&local_20);
    pBVar3 = std::
             unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>::
             operator->((unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>
                         *)0x14fc45);
    uVar2 = (*pBVar3->_vptr_BaseCommand[3])
                      (pBVar3,(ulong)local_c,
                       (in_RDI->
                       super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if ((uVar2 & 1) == 0) {
      local_d = 0;
      goto LAB_0014fc72;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_*,_std::vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

bool  all_skip(int i) const
  {
      bool skip = true;
      for (auto& cmd : master.commands_)
      {
          if (!cmd->skip(i, master))
          {
              skip = false;
              break;
          }
      }
      return skip;
  }